

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O3

r_memory_map * __thiscall r_memory_map::operator=(r_memory_map *this,r_memory_map *obj)

{
  if (this->_mem != (void *)0x0) {
    munmap(this->_mem,this->_length);
    this->_mem = (void *)0x0;
  }
  this->_mem = obj->_mem;
  obj->_mem = (void *)0x0;
  this->_length = obj->_length;
  obj->_length = 0;
  this->_mapOffset = obj->_mapOffset;
  obj->_mapOffset = 0;
  return this;
}

Assistant:

r_memory_map& r_memory_map::operator = (r_memory_map&& obj) noexcept
{
    _close();

    _mem = move(obj._mem);
    obj._mem = NULL;

    _length = move(obj._length);
    obj._length = 0;

    _mapOffset = move(obj._mapOffset);
    obj._mapOffset = 0;

    return *this;
}